

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::transmitDelayedMessages(CommonCore *this)

{
  bool bVar1;
  ActionMessage *pAVar2;
  optional<helics::ActionMessage> *in_RDI;
  ActionMessage *in_stack_000000e8;
  optional<helics::ActionMessage> msg;
  optional<helics::ActionMessage> *in_stack_fffffffffffffe48;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_fffffffffffffe88;
  GlobalFederateId local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffe88);
  do {
    bVar1 = std::optional::operator_cast_to_bool((optional<helics::ActionMessage> *)0x4a4ead);
    if (!bVar1) {
      std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x4a4fd9);
      return;
    }
    pAVar2 = std::optional<helics::ActionMessage>::operator->
                       ((optional<helics::ActionMessage> *)0x4a4ec3);
    local_cc = 0;
    bVar1 = GlobalFederateId::operator==(&pAVar2->source_id,(GlobalBrokerId)0x0);
    if (bVar1) {
LAB_004a4f1a:
      GlobalFederateId::GlobalFederateId
                (&local_d4,
                 (GlobalBrokerId)
                 (in_RDI->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload.
                 super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                 super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_handle
                 .hid);
      pAVar2 = std::optional<helics::ActionMessage>::operator->
                         ((optional<helics::ActionMessage> *)0x4a4f4a);
      (pAVar2->source_id).gid = local_d4.gid;
    }
    else {
      pAVar2 = std::optional<helics::ActionMessage>::operator->
                         ((optional<helics::ActionMessage> *)0x4a4ef4);
      local_d0 = 0xfffc6902;
      bVar1 = GlobalFederateId::operator==(&pAVar2->source_id,(GlobalFederateId)0xfffc6902);
      if (bVar1) goto LAB_004a4f1a;
    }
    std::optional<helics::ActionMessage>::operator*((optional<helics::ActionMessage> *)0x4a4f61);
    routeMessage((CommonCore *)
                 msg.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                 super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                 super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_,
                 in_stack_000000e8);
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop(in_stack_fffffffffffffe88)
    ;
    std::optional<helics::ActionMessage>::operator=(in_RDI,in_stack_fffffffffffffe48);
    std::optional<helics::ActionMessage>::~optional((optional<helics::ActionMessage> *)0x4a4fa4);
  } while( true );
}

Assistant:

void CommonCore::transmitDelayedMessages()
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if (msg->source_id == parent_broker_id || msg->source_id == gDirectCoreId) {
            msg->source_id = global_broker_id_local;
        }
        routeMessage(*msg);
        msg = delayTransmitQueue.pop();
    }
}